

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::(anonymous_namespace)::strcpy_insitu<char*,unsigned_long>
               (char **dest,unsigned_long *header,uintptr_t header_mask,char_t *source,
               size_t source_length)

{
  bool bVar1;
  xml_memory_page *__dest;
  void *in_RCX;
  unsigned_long *in_RDX;
  xml_allocator *in_RSI;
  xml_allocator *in_RDI;
  char_t *in_R8;
  char_t *buf;
  xml_allocator *alloc_1;
  xml_allocator *alloc;
  bool local_1;
  
  if (in_R8 == (char_t *)0x0) {
    if (((ulong)in_RSI->_root & (ulong)in_RDX) != 0) {
      anon_unknown_0::xml_allocator::deallocate_string(in_RDI,(char_t *)in_RSI);
    }
    in_RDI->_root = (xml_memory_page *)0x0;
    in_RSI->_root = (xml_memory_page *)(((ulong)in_RDX ^ 0xffffffffffffffff) & (ulong)in_RSI->_root)
    ;
    local_1 = true;
  }
  else if ((in_RDI->_root == (xml_memory_page *)0x0) ||
          (bVar1 = anon_unknown_0::strcpy_insitu_allow<unsigned_long>
                             ((size_t)in_RSI,in_RDX,(uintptr_t)in_RCX,in_R8), !bVar1)) {
    bVar1 = anon_unknown_0::xml_allocator::reserve
                      (*(xml_allocator **)((long)in_RSI - ((ulong)in_RSI->_root >> 8)));
    if (bVar1) {
      __dest = (xml_memory_page *)
               anon_unknown_0::xml_allocator::allocate_string(in_RSI,(size_t)in_RDX);
      if (__dest == (xml_memory_page *)0x0) {
        local_1 = false;
      }
      else {
        memcpy(__dest,in_RCX,(size_t)in_R8);
        in_R8[(long)&__dest->allocator] = '\0';
        if (((ulong)in_RSI->_root & (ulong)in_RDX) != 0) {
          anon_unknown_0::xml_allocator::deallocate_string(in_RDI,(char_t *)in_RSI);
        }
        in_RDI->_root = __dest;
        in_RSI->_root = (xml_memory_page *)((ulong)in_RDX | (ulong)in_RSI->_root);
        local_1 = true;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    memcpy(in_RDI->_root,in_RCX,(size_t)in_R8);
    in_R8[(long)in_RDI->_root] = '\0';
    local_1 = true;
  }
  return local_1;
}

Assistant:

PUGI_IMPL_FN bool strcpy_insitu(String& dest, Header& header, uintptr_t header_mask, const char_t* source, size_t source_length)
	{
		assert((header & header_mask) == 0 || dest); // header bit indicates whether dest was previously allocated

		if (source_length == 0)
		{
			// empty string and null pointer are equivalent, so just deallocate old memory
			xml_allocator* alloc = PUGI_IMPL_GETPAGE_IMPL(header)->allocator;

			if (header & header_mask) alloc->deallocate_string(dest);

			// mark the string as not allocated
			dest = NULL;
			header &= ~header_mask;

			return true;
		}
		else if (dest && strcpy_insitu_allow(source_length, header, header_mask, dest))
		{
			// we can reuse old buffer, so just copy the new data (including zero terminator)
			memcpy(dest, source, source_length * sizeof(char_t));
			dest[source_length] = 0;

			return true;
		}
		else
		{
			xml_allocator* alloc = PUGI_IMPL_GETPAGE_IMPL(header)->allocator;

			if (!alloc->reserve()) return false;

			// allocate new buffer
			char_t* buf = alloc->allocate_string(source_length + 1);
			if (!buf) return false;

			// copy the string (including zero terminator)
			memcpy(buf, source, source_length * sizeof(char_t));
			buf[source_length] = 0;

			// deallocate old buffer (*after* the above to protect against overlapping memory and/or allocation failures)
			if (header & header_mask) alloc->deallocate_string(dest);

			// the string is now allocated, so set the flag
			dest = buf;
			header |= header_mask;

			return true;
		}
	}